

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md3.cpp
# Opt level: O1

void __thiscall FMD3Model::BuildVertexBuffer(FMD3Model *this)

{
  MD3Surface *this_00;
  int iVar1;
  MD3Surface *pMVar2;
  MD3TexCoord *pMVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  FModelVertexBuffer *this_01;
  FModelVertex *pFVar8;
  uint *puVar9;
  ulong uVar10;
  MD3Triangle *pMVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  float *pfVar17;
  uint uVar18;
  
  if ((this->super_FModel).mVBuf != (FModelVertexBuffer *)0x0) {
    return;
  }
  LoadGeometry(this);
  if ((long)this->numSurfaces < 1) {
    uVar14 = 0;
    uVar18 = 0;
  }
  else {
    lVar15 = 0;
    uVar18 = 0;
    uVar14 = 0;
    do {
      uVar18 = uVar18 + *(int *)((long)&this->surfaces->numVertices + lVar15) * this->numFrames;
      uVar14 = uVar14 + *(int *)((long)&this->surfaces->numTriangles + lVar15) * 3;
      lVar15 = lVar15 + 0x38;
    } while ((long)this->numSurfaces * 0x38 - lVar15 != 0);
  }
  this_01 = (FModelVertexBuffer *)operator_new(0x28);
  FModelVertexBuffer::FModelVertexBuffer(this_01,true,this->numFrames == 1);
  (this->super_FModel).mVBuf = this_01;
  pFVar8 = FModelVertexBuffer::LockVertexBuffer(this_01,uVar18);
  puVar9 = FModelVertexBuffer::LockIndexBuffer((this->super_FModel).mVBuf,uVar14);
  if ((pFVar8 != (FModelVertex *)0x0) && (puVar9 != (uint *)0x0)) {
    if (0 < this->numSurfaces) {
      lVar15 = 0;
      uVar18 = 0;
      uVar14 = 0;
      do {
        pMVar2 = this->surfaces;
        this_00 = pMVar2 + lVar15;
        pMVar2[lVar15].vindex = uVar18;
        pMVar2[lVar15].iindex = uVar14;
        iVar1 = pMVar2[lVar15].numVertices;
        uVar6 = this->numFrames * iVar1;
        if (0 < (int)uVar6) {
          pMVar3 = this_00->texcoords;
          pfVar17 = &this_00->vertices->z;
          uVar12 = 0;
          do {
            uVar7 = uVar18 + (int)uVar12;
            uVar10 = *(ulong *)(pfVar17 + -1) << 0x20 | *(ulong *)(pfVar17 + -1) >> 0x20;
            fVar4 = pMVar3[(long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff)
                           % (long)iVar1 & 0xffffffff].s;
            fVar5 = pMVar3[(long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff)
                           % (long)iVar1 & 0xffffffff].t;
            pFVar8[uVar7].x = ((MD3Vertex *)(pfVar17 + -2))->x;
            pFVar8[uVar7].y = (float)(int)uVar10;
            pFVar8[uVar7].z = (float)(int)(uVar10 >> 0x20);
            pFVar8[uVar7].u = fVar4;
            pFVar8[uVar7].v = fVar5;
            uVar12 = uVar12 + 1;
            pfVar17 = pfVar17 + 6;
          } while (uVar6 != uVar12);
          uVar18 = uVar18 + (int)uVar12;
        }
        if (0 < this_00->numTriangles) {
          pMVar11 = this_00->tris;
          lVar13 = 0;
          do {
            uVar6 = uVar14;
            lVar16 = 0;
            do {
              puVar9[uVar6 + (int)lVar16] = pMVar11->VertIndex[lVar16];
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            lVar13 = lVar13 + 1;
            pMVar11 = pMVar11 + 1;
            uVar14 = uVar6 + 3;
          } while (lVar13 < this_00->numTriangles);
          uVar14 = uVar6 + 3;
        }
        MD3Surface::UnloadGeometry(this_00);
        lVar15 = lVar15 + 1;
      } while (lVar15 < this->numSurfaces);
    }
    FModelVertexBuffer::UnlockVertexBuffer((this->super_FModel).mVBuf);
    FModelVertexBuffer::UnlockIndexBuffer((this->super_FModel).mVBuf);
    return;
  }
  __assert_fail("vertptr != nullptr && indxptr != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/gl/models/gl_models_md3.cpp"
                ,0x114,"virtual void FMD3Model::BuildVertexBuffer()");
}

Assistant:

void FMD3Model::BuildVertexBuffer()
{
	if (mVBuf == nullptr)
	{
		LoadGeometry();

		unsigned int vbufsize = 0;
		unsigned int ibufsize = 0;

		for (int i = 0; i < numSurfaces; i++)
		{
			MD3Surface * surf = &surfaces[i];
			vbufsize += numFrames * surf->numVertices;
			ibufsize += 3 * surf->numTriangles;
		}

		mVBuf = new FModelVertexBuffer(true, numFrames == 1);
		FModelVertex *vertptr = mVBuf->LockVertexBuffer(vbufsize);
		unsigned int *indxptr = mVBuf->LockIndexBuffer(ibufsize);

		assert(vertptr != nullptr && indxptr != nullptr);

		unsigned int vindex = 0, iindex = 0;

		for (int i = 0; i < numSurfaces; i++)
		{
			MD3Surface * surf = &surfaces[i];

			surf->vindex = vindex;
			surf->iindex = iindex;
			for (int j = 0; j < numFrames * surf->numVertices; j++)
			{
				MD3Vertex* vert = surf->vertices + j;

				FModelVertex *bvert = &vertptr[vindex++];

				int tc = j % surf->numVertices;
				bvert->Set(vert->x, vert->z, vert->y, surf->texcoords[tc].s, surf->texcoords[tc].t);
				bvert->SetNormal(vert->nx, vert->nz, vert->ny);
			}

			for (int k = 0; k < surf->numTriangles; k++)
			{
				for (int l = 0; l < 3; l++)
				{
					indxptr[iindex++] = surf->tris[k].VertIndex[l];
				}
			}
			surf->UnloadGeometry();
		}
		mVBuf->UnlockVertexBuffer();
		mVBuf->UnlockIndexBuffer();
	}
}